

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void prvTidyResetTags(TidyDocImpl *doc)

{
  _DictHash *p_Var1;
  DictHash *pDVar2;
  Dict *np;
  Dict *pDVar3;
  uint i;
  long lVar4;
  
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_A) goto LAB_00144737;
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = (Dict *)0x0;
LAB_00144737:
  if (pDVar3 != (Dict *)0x0) {
    pDVar3->parser = prvTidyParseBlock;
    pDVar3->model = 0x20018;
  }
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_CAPTION) goto LAB_00144765;
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = (Dict *)0x0;
LAB_00144765:
  if (pDVar3 != (Dict *)0x0) {
    pDVar3->parser = prvTidyParseBlock;
  }
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_OBJECT) goto LAB_0014478c;
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = (Dict *)0x0;
LAB_0014478c:
  if (pDVar3 != (Dict *)0x0) {
    pDVar3->model = 0x11810;
  }
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_BUTTON) goto LAB_001447af;
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = (Dict *)0x0;
LAB_001447af:
  if (pDVar3 != (Dict *)0x0) {
    pDVar3->parser = prvTidyParseInline;
  }
  lVar4 = 0;
  do {
    pDVar2 = (doc->tags).hashtab[lVar4];
    while (pDVar2 != (DictHash *)0x0) {
      p_Var1 = pDVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
      pDVar2 = p_Var1;
    }
    (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb2);
  doc->HTML5Mode = yes;
  return;
}

Assistant:

void TY_(ResetTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseBlock);
        np->model  = (CM_INLINE|CM_BLOCK|CM_MIXED);
    }
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseBlock);
    }

    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model = (CM_OBJECT|CM_IMG|CM_INLINE|CM_PARAM); /* reset */
    }
    /*\
     * Issue #461
     * TidyTag_BUTTON reset to inline in HTML5
    \*/
    np = (Dict *)TY_(LookupTagDef)(TidyTag_BUTTON);
    if (np)
    {
        np->parser = TY_(ParseInline);
    }

    tagsEmptyHash( doc, tags ); /* not sure this is really required, but to be sure */
    doc->HTML5Mode = yes;   /* set HTML5 mode */
}